

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O2

bool __thiscall TRM::TGAImage::read_tga_file(TGAImage *this,char *filename)

{
  char cVar1;
  bool bVar2;
  uchar *puVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  TGAHeader header;
  ifstream in;
  int aiStack_200 [122];
  
  if (this->data != (uchar *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (uchar *)0x0;
  std::ifstream::ifstream(&in);
  std::ifstream::open((char *)&in,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar6 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar6 = std::operator<<(poVar6,filename);
    std::operator<<(poVar6,"\n");
    std::ifstream::close();
  }
  else {
    std::istream::read((char *)&in,(long)&header);
    if (*(int *)((long)aiStack_200 + *(long *)(_in + -0x18)) == 0) {
      this->width = (uint)header.width;
      this->height = (uint)header.height;
      uVar4 = (uint)(header.bitsperpixel >> 3);
      this->bytespp = uVar4;
      if (((header.height != 0 && header.width != 0) && (header.bitsperpixel >> 3 < 5)) &&
         ((0x1aU >> uVar4 & 1) != 0)) {
        puVar3 = (uchar *)operator_new__((ulong)((uint)header.height * (uint)header.width * uVar4));
        this->data = puVar3;
        if ((header.datatypecode & 0xfe) == 10) {
          bVar2 = load_rle_data(this,&in);
          if (bVar2) {
LAB_00103cd6:
            if ((header.imagedescriptor & 0x20) == 0) {
              flip_vertically(this);
            }
            if ((header.imagedescriptor & 0x10) != 0) {
              flip_horizontally(this);
            }
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->width);
            poVar6 = std::operator<<(poVar6,"x");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->height);
            poVar6 = std::operator<<(poVar6,"/");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->bytespp << 3);
            std::operator<<(poVar6,"\n");
            bVar2 = true;
            std::ifstream::close();
            goto LAB_00103c36;
          }
LAB_00103ca8:
          std::ifstream::close();
          pcVar5 = "an error occured while reading the data\n";
          poVar6 = (ostream *)&std::cerr;
        }
        else {
          if ((header.datatypecode & 0xfe) == 2) {
            std::istream::read((char *)&in,(long)puVar3);
            if (*(int *)((long)aiStack_200 + *(long *)(_in + -0x18)) == 0) goto LAB_00103cd6;
            goto LAB_00103ca8;
          }
          std::ifstream::close();
          poVar6 = std::operator<<((ostream *)&std::cerr,"unknown file format ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)header.datatypecode);
          pcVar5 = "\n";
        }
        std::operator<<(poVar6,pcVar5);
        goto LAB_00103c34;
      }
      std::ifstream::close();
      pcVar5 = "bad bpp (or width/height) value\n";
    }
    else {
      std::ifstream::close();
      pcVar5 = "an error occured while reading the header\n";
    }
    std::operator<<((ostream *)&std::cerr,pcVar5);
  }
LAB_00103c34:
  bVar2 = false;
LAB_00103c36:
  std::ifstream::~ifstream(&in);
  return bVar2;
}

Assistant:

bool TGAImage::read_tga_file(const char *filename) {
  if (data) delete[] data;
  data = NULL;
  std::ifstream in;
  in.open(filename, std::ios::binary);
  if (!in.is_open()) {
    std::cerr << "can't open file " << filename << "\n";
    in.close();
    return false;
  }
  TGAHeader header;
  in.read((char *)&header, sizeof(header));
  if (!in.good()) {
    in.close();
    std::cerr << "an error occured while reading the header\n";
    return false;
  }
  width = header.width;
  height = header.height;
  bytespp = header.bitsperpixel >> 3;
  if (width <= 0 || height <= 0 ||
      (bytespp != GRAYSCALE && bytespp != RGB && bytespp != RGBA)) {
    in.close();
    std::cerr << "bad bpp (or width/height) value\n";
    return false;
  }
  unsigned long nbytes = bytespp * width * height;
  data = new unsigned char[nbytes];
  if (3 == header.datatypecode || 2 == header.datatypecode) {
    in.read((char *)data, nbytes);
    if (!in.good()) {
      in.close();
      std::cerr << "an error occured while reading the data\n";
      return false;
    }
  } else if (10 == header.datatypecode || 11 == header.datatypecode) {
    if (!load_rle_data(in)) {
      in.close();
      std::cerr << "an error occured while reading the data\n";
      return false;
    }
  } else {
    in.close();
    std::cerr << "unknown file format " << (int)header.datatypecode << "\n";
    return false;
  }
  if (!(header.imagedescriptor & 0x20)) {
    flip_vertically();
  }
  if (header.imagedescriptor & 0x10) {
    flip_horizontally();
  }
  std::cerr << width << "x" << height << "/" << bytespp * 8 << "\n";
  in.close();
  return true;
}